

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O0

bool miniminer_tests::sanity_check
               (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *transactions,
               map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *bumpfees)

{
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __first;
  bool bVar1;
  type *__src;
  type_conflict6 *ptVar2;
  size_type sVar3;
  size_type sVar4;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar5;
  size_t i;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1_1;
  bool found;
  type *fee;
  type *outpoint;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  *__range1;
  const_iterator bumpfee;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  set<long,_std::less<long>,_std::allocator<long>_> distinct_bumpfees;
  COutPoint outpoint_;
  undefined4 in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  undefined6 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe96;
  undefined1 in_stack_fffffffffffffe97;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffe98;
  anon_class_8_1_96ed603d_for__M_pred in_stack_fffffffffffffea8;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  in_stack_fffffffffffffeb0;
  ulong uVar6;
  undefined4 in_stack_fffffffffffffeb8;
  uint uVar7;
  undefined4 in_stack_fffffffffffffebc;
  ulong local_138;
  byte local_c9;
  undefined1 local_2c [36];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
  begin((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
         *)CONCAT17(in_stack_fffffffffffffe97,
                    CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
  std::
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>::
  end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
       *)CONCAT17(in_stack_fffffffffffffe97,
                  CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe98._M_node,
                                 (_Self *)CONCAT17(in_stack_fffffffffffffe97,
                                                   CONCAT16(in_stack_fffffffffffffe96,
                                                            in_stack_fffffffffffffe90))),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_long>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_long>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    __src = std::get<0ul,COutPoint_const,long>
                      ((pair<const_COutPoint,_long> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ptVar2 = std::get<1ul,COutPoint_const,long>
                       ((pair<const_COutPoint,_long> *)
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (*ptVar2 < 0) {
      local_c9 = 0;
      goto LAB_0075a0ba;
    }
    if (*ptVar2 != 0) {
      memcpy(local_2c,__src,0x24);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::cbegin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)CONCAT17(in_stack_fffffffffffffe97,
                           CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::cend((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,
                         CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
      __first._M_current._4_4_ = in_stack_fffffffffffffebc;
      __first._M_current._0_4_ = in_stack_fffffffffffffeb8;
      bVar1 = std::
              any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<CTransaction_const>const*,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>,miniminer_tests::sanity_check(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::map<COutPoint,long,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,long>>>const&)::_lambda(auto:1_const&)_1_>
                        (__first,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (!bVar1) {
        local_c9 = 0;
        goto LAB_0075a0ba;
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_long>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)CONCAT17(in_stack_fffffffffffffe97,
                      CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)CONCAT17(in_stack_fffffffffffffe97,
                    CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffe98._M_node,
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe97,
                                        CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90
                                                ))), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    sVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (1 < sVar3) {
      std::set<long,_std::less<long>,_std::allocator<long>_>::set
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_138 = 0;
      while( true ) {
        uVar6 = local_138;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        sVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                          ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        if (sVar3 <= uVar6) break;
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        CTransaction::GetHash
                  ((CTransaction *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        COutPoint::COutPoint
                  ((COutPoint *)in_stack_fffffffffffffe98._M_node,
                   (Txid *)CONCAT17(in_stack_fffffffffffffe97,
                                    CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
                   in_stack_fffffffffffffe8c);
        std::
        map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::find((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                *)CONCAT17(in_stack_fffffffffffffe97,
                           CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)),
               (key_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        std::
        map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
        ::end((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               *)CONCAT17(in_stack_fffffffffffffe97,
                          CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90)));
        bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe98._M_node,
                                (_Self *)CONCAT17(in_stack_fffffffffffffe97,
                                                  CONCAT16(in_stack_fffffffffffffe96,
                                                           in_stack_fffffffffffffe90)));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::_Rb_tree_const_iterator<std::pair<const_COutPoint,_long>_>::operator->
                    ((_Rb_tree_const_iterator<std::pair<const_COutPoint,_long>_> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)
                             in_stack_fffffffffffffe98._M_node,
                             (value_type_conflict6 *)
                             CONCAT17(in_stack_fffffffffffffe97,
                                      CONCAT16(in_stack_fffffffffffffe96,in_stack_fffffffffffffe90))
                            );
          in_stack_fffffffffffffe98 = pVar5.first._M_node;
          in_stack_fffffffffffffe97 = pVar5.second;
        }
        local_138 = local_138 + 1;
      }
      sVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (1 < sVar4) {
        local_c9 = 0;
      }
      uVar7 = (uint)(1 < sVar4);
      std::set<long,_std::less<long>,_std::allocator<long>_>::~set
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (uVar7 != 0) goto LAB_0075a0ba;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  local_c9 = 1;
LAB_0075a0ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_c9 & 1);
}

Assistant:

static inline bool sanity_check(const std::vector<CTransactionRef>& transactions,
                                const std::map<COutPoint, CAmount>& bumpfees)
{
    // No negative bumpfees.
    for (const auto& [outpoint, fee] : bumpfees) {
        if (fee < 0) return false;
        if (fee == 0) continue;
        auto outpoint_ = outpoint; // structured bindings can't be captured in C++17, so we need to use a variable
        const bool found = std::any_of(transactions.cbegin(), transactions.cend(), [&](const auto& tx) {
            return outpoint_.hash == tx->GetHash() && outpoint_.n < tx->vout.size();
        });
        if (!found) return false;
    }
    for (const auto& tx : transactions) {
        // If tx has multiple outputs, they must all have the same bumpfee (if they exist).
        if (tx->vout.size() > 1) {
            std::set<CAmount> distinct_bumpfees;
            for (size_t i{0}; i < tx->vout.size(); ++i) {
                const auto bumpfee = bumpfees.find(COutPoint{tx->GetHash(), static_cast<uint32_t>(i)});
                if (bumpfee != bumpfees.end()) distinct_bumpfees.insert(bumpfee->second);
            }
            if (distinct_bumpfees.size() > 1) return false;
        }
    }
    return true;
}